

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::NegateBindStatistics(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  LogicalType *pLVar1;
  BoundFunctionExpression *pBVar2;
  bool bVar3;
  uint uVar4;
  reference stats_00;
  Value new_max;
  Value new_min;
  BaseStatistics stats;
  LogicalType LStack_178;
  LogicalType local_160;
  LogicalType local_148;
  LogicalType local_130;
  Value local_118;
  Value local_d8;
  BaseStatistics local_98;
  LogicalType local_40;
  
  pBVar2 = input->expr;
  stats_00 = vector<duckdb::BaseStatistics,_true>::operator[](input->child_stats,0);
  LogicalType::LogicalType(&local_40,SQLNULL);
  Value::Value(&local_d8,&local_40);
  LogicalType::~LogicalType(&local_40);
  LogicalType::LogicalType(&local_130,SQLNULL);
  Value::Value(&local_118,&local_130);
  LogicalType::~LogicalType(&local_130);
  bVar3 = NumericStats::HasMinMax(stats_00);
  if (bVar3) {
    uVar4 = (uint)(pBVar2->super_Expression).return_type.physical_type_;
    if (6 < uVar4 - 3) {
switchD_0104756d_caseD_4:
      *(undefined8 *)this = 0;
      goto LAB_010476df;
    }
    pLVar1 = &(pBVar2->super_Expression).return_type;
    switch(uVar4) {
    case 3:
      bVar3 = NegatePropagateStatistics::Operation<signed_char>
                        (pLVar1,stats_00,&local_d8,&local_118);
      break;
    default:
      goto switchD_0104756d_caseD_4;
    case 5:
      bVar3 = NegatePropagateStatistics::Operation<short>(pLVar1,stats_00,&local_d8,&local_118);
      break;
    case 7:
      bVar3 = NegatePropagateStatistics::Operation<int>(pLVar1,stats_00,&local_d8,&local_118);
      break;
    case 9:
      bVar3 = NegatePropagateStatistics::Operation<long>(pLVar1,stats_00,&local_d8,&local_118);
    }
    if (bVar3 != false) goto LAB_010475d1;
  }
  else {
LAB_010475d1:
    pLVar1 = &(pBVar2->super_Expression).return_type;
    LogicalType::LogicalType(&local_148,pLVar1);
    Value::Value((Value *)&local_98,&local_148);
    Value::operator=(&local_d8,(Value *)&local_98);
    Value::~Value((Value *)&local_98);
    LogicalType::~LogicalType(&local_148);
    LogicalType::LogicalType(&local_160,pLVar1);
    Value::Value((Value *)&local_98,&local_160);
    Value::operator=(&local_118,(Value *)&local_98);
    Value::~Value((Value *)&local_98);
    LogicalType::~LogicalType(&local_160);
  }
  LogicalType::LogicalType(&LStack_178,&(pBVar2->super_Expression).return_type);
  NumericStats::CreateEmpty(&local_98,&LStack_178);
  LogicalType::~LogicalType(&LStack_178);
  NumericStats::SetMin(&local_98,&local_d8);
  NumericStats::SetMax(&local_98,&local_118);
  BaseStatistics::CopyValidity(&local_98,stats_00);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_98);
LAB_010476df:
  Value::~Value(&local_118);
  Value::~Value(&local_d8);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> NegateBindStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 1);
	// can only propagate stats if the children have stats
	auto &istats = child_stats[0];
	Value new_min, new_max;
	bool potential_overflow = true;
	if (NumericStats::HasMinMax(istats)) {
		switch (expr.return_type.InternalType()) {
		case PhysicalType::INT8:
			potential_overflow =
			    NegatePropagateStatistics::Operation<int8_t>(expr.return_type, istats, new_min, new_max);
			break;
		case PhysicalType::INT16:
			potential_overflow =
			    NegatePropagateStatistics::Operation<int16_t>(expr.return_type, istats, new_min, new_max);
			break;
		case PhysicalType::INT32:
			potential_overflow =
			    NegatePropagateStatistics::Operation<int32_t>(expr.return_type, istats, new_min, new_max);
			break;
		case PhysicalType::INT64:
			potential_overflow =
			    NegatePropagateStatistics::Operation<int64_t>(expr.return_type, istats, new_min, new_max);
			break;
		default:
			return nullptr;
		}
	}
	if (potential_overflow) {
		new_min = Value(expr.return_type);
		new_max = Value(expr.return_type);
	}
	auto stats = NumericStats::CreateEmpty(expr.return_type);
	NumericStats::SetMin(stats, new_min);
	NumericStats::SetMax(stats, new_max);
	stats.CopyValidity(istats);
	return stats.ToUnique();
}